

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef BinaryenGlobalGet(BinaryenModuleRef module,char *name,BinaryenType type)

{
  GlobalGet *pGVar1;
  Name local_48;
  size_t local_38;
  char *pcStack_30;
  
  wasm::Name::Name(&local_48,name);
  local_38 = local_48.super_IString.str._M_len;
  pcStack_30 = local_48.super_IString.str._M_str;
  pGVar1 = MixedArena::alloc<wasm::GlobalGet>(&module->allocator);
  (pGVar1->name).super_IString.str._M_len = local_38;
  (pGVar1->name).super_IString.str._M_str = pcStack_30;
  (pGVar1->super_SpecificExpression<(wasm::Expression::Id)10>).super_Expression.type.id = type;
  return (BinaryenExpressionRef)pGVar1;
}

Assistant:

BinaryenExpressionRef BinaryenGlobalGet(BinaryenModuleRef module,
                                        const char* name,
                                        BinaryenType type) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeGlobalGet(name, Type(type)));
}